

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_bitshift(ASMState *as,IRIns *ir,x86Shift xs,x86Op xv)

{
  byte bVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  IRIns *pIVar6;
  MCode *pMVar7;
  Reg r2;
  Reg RVar8;
  Reg RVar9;
  MCode MVar10;
  uint uVar11;
  MCode MVar12;
  uint uVar13;
  x86Op xVar14;
  
  uVar2 = (ir->field_0).op2;
  pIVar6 = as->ir;
  if ((short)uVar2 < 0) {
    if ((xv != XOg_FADDq) && ((as->flags & 0x40) != 0)) {
      r2 = ra_dest(as,ir,0xffef);
      RVar9 = ra_alloc1(as,(uint)uVar2,0xffef);
      uVar11._0_2_ = *(IROpT *)((long)ir + 4);
      uVar11._2_2_ = *(IRRef1 *)((long)ir + 6);
      RVar8 = asm_fuseloadm(as,(uint)(ir->field_0).op1,~(1 << (RVar9 & 0x1f)) & 0xffef,
                            (uint)((0x604208U >> (uVar11 & 0x1f) & 1) != 0));
      xVar14 = RVar9 << 0x13 ^ (0x604208U >> ((ir->field_1).t.irt & 0x1f) & 1) * 0x800000 + xv;
      goto LAB_0013554e;
    }
    r2 = ra_dest(as,ir,0xffed);
    if (r2 == 1) {
      r2 = ra_scratch(as,0xffed);
      uVar13._0_2_ = *(IROpT *)((long)ir + 4);
      uVar13._2_2_ = *(IRRef1 *)((long)ir + 6);
      RVar9 = 0x80201;
      if ((0x604208U >> (uVar13 & 0x1f) & 1) == 0) {
        RVar9 = 1;
      }
      emit_rr(as,XO_MOV,RVar9,r2);
    }
    bVar1 = *(byte *)((long)pIVar6 + (ulong)uVar2 * 8 + 6);
    RVar9 = (Reg)bVar1;
    if ((char)bVar1 < '\0') {
      RVar9 = ra_allocref(as,(uint)uVar2,2);
    }
    else if (bVar1 == 1) {
      RVar9 = 1;
    }
    else {
      ra_scratch(as,2);
    }
    uVar5._0_2_ = *(IROpT *)((long)ir + 4);
    uVar5._2_2_ = *(IRRef1 *)((long)ir + 6);
    emit_rr(as,XO_SHIFTcl,(-(uint)((0x604208U >> (uVar5 & 0x1f) & 1) != 0) & 0x80200) + xs,r2);
    bVar1 = (byte)RVar9 & 0x1f;
    as->weakset = as->weakset & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    if (RVar9 == 1) goto LAB_001355d0;
    RVar8 = 1;
    xVar14 = XO_MOV;
  }
  else {
    r2 = ra_dest(as,ir,0xffef);
    uVar3._0_2_ = *(IROpT *)((long)ir + 4);
    uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar11 = (uint)((0x604208U >> (uVar3 & 0x1f) & 1) != 0);
    uVar13 = (uVar11 << 5 | 0x1f) & pIVar6[uVar2].field_1.op12;
    MVar12 = (MCode)uVar13;
    if ((((xv == XOg_FADDq) && (uVar13 != 0)) && ((as->flags & 0x40) != 0)) &&
       (RVar8 = asm_fuseloadm(as,(uint)(ir->field_0).op1,0xffef,uVar11), RVar8 != r2)) {
      MVar10 = -MVar12;
      if (xs != XOg_ROL) {
        MVar10 = MVar12;
      }
      pMVar7 = as->mcp;
      as->mcp = pMVar7 + -1;
      pMVar7[-1] = MVar10;
      xVar14 = (0x604208U >> ((ir->field_1).t.irt & 0x1f) & 1) << 0x17 | XV_RORX;
LAB_0013554e:
      emit_mrm(as,xVar14,r2,RVar8);
      return;
    }
    if (uVar13 == 0) goto LAB_001355d0;
    if (uVar13 == 1) {
      uVar4._0_2_ = *(IROpT *)((long)ir + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)ir + 6);
      xVar14 = XO_SHIFT1;
    }
    else {
      pMVar7 = as->mcp;
      as->mcp = pMVar7 + -1;
      pMVar7[-1] = MVar12;
      uVar4._0_2_ = *(IROpT *)((long)ir + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)ir + 6);
      xVar14 = XO_SHIFTi;
    }
    RVar8 = (-(uint)((0x604208U >> (uVar4 & 0x1f) & 1) != 0) & 0x80200) + xs;
    RVar9 = r2;
  }
  emit_rr(as,xVar14,RVar8,RVar9);
LAB_001355d0:
  ra_left(as,r2,(uint)(ir->field_0).op1);
  return;
}

Assistant:

static void asm_bitshift(ASMState *as, IRIns *ir, x86Shift xs, x86Op xv)
{
  IRRef rref = ir->op2;
  IRIns *irr = IR(rref);
  Reg dest;
  if (irref_isk(rref)) {  /* Constant shifts. */
    int shift;
    dest = ra_dest(as, ir, RSET_GPR);
    shift = irr->i & (irt_is64(ir->t) ? 63 : 31);
    if (!xv && shift && (as->flags & JIT_F_BMI2)) {
      Reg left = asm_fuseloadm(as, ir->op1, RSET_GPR, irt_is64(ir->t));
      if (left != dest) {  /* BMI2 rotate right by constant. */
	emit_i8(as, xs == XOg_ROL ? -shift : shift);
	emit_mrm(as, VEX_64IR(ir, XV_RORX), dest, left);
	return;
      }
    }
    switch (shift) {
    case 0: break;
    case 1: emit_rr(as, XO_SHIFT1, REX_64IR(ir, xs), dest); break;
    default: emit_shifti(as, REX_64IR(ir, xs), dest, shift); break;
    }
  } else if ((as->flags & JIT_F_BMI2) && xv) {	/* BMI2 variable shifts. */
    Reg left, right;
    dest = ra_dest(as, ir, RSET_GPR);
    right = ra_alloc1(as, rref, RSET_GPR);
    left = asm_fuseloadm(as, ir->op1, rset_exclude(RSET_GPR, right),
			 irt_is64(ir->t));
    emit_mrm(as, VEX_64IR(ir, xv) ^ (right << 19), dest, left);
    return;
  } else {  /* Variable shifts implicitly use register cl (i.e. ecx). */
    Reg right;
    dest = ra_dest(as, ir, rset_exclude(RSET_GPR, RID_ECX));
    if (dest == RID_ECX) {
      dest = ra_scratch(as, rset_exclude(RSET_GPR, RID_ECX));
      emit_rr(as, XO_MOV, REX_64IR(ir, RID_ECX), dest);
    }
    right = irr->r;
    if (ra_noreg(right))
      right = ra_allocref(as, rref, RID2RSET(RID_ECX));
    else if (right != RID_ECX)
      ra_scratch(as, RID2RSET(RID_ECX));
    emit_rr(as, XO_SHIFTcl, REX_64IR(ir, xs), dest);
    ra_noweak(as, right);
    if (right != RID_ECX)
      emit_rr(as, XO_MOV, RID_ECX, right);
  }
  ra_left(as, dest, ir->op1);
  /*
  ** Note: avoid using the flags resulting from a shift or rotate!
  ** All of them cause a partial flag stall, except for r,1 shifts
  ** (but not rotates). And a shift count of 0 leaves the flags unmodified.
  */
}